

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void matrixadd(float32 **a,float32 **b,int32 n)

{
  int local_24;
  int local_20;
  int32 j;
  int32 i;
  int32 n_local;
  float32 **b_local;
  float32 **a_local;
  
  for (local_20 = 0; local_20 < n; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < n; local_24 = local_24 + 1) {
      a[local_20][local_24] = (float32)((float)b[local_20][local_24] + (float)a[local_20][local_24])
      ;
    }
  }
  return;
}

Assistant:

void
matrixadd(float32 ** a, float32 ** b, int32 n)
{
    int32 i, j;

    for (i = 0; i < n; ++i)
        for (j = 0; j < n; ++j)
            a[i][j] += b[i][j];
}